

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O3

float lda_loop(lda *l,v_array<float> *Elogtheta,float *v,example *ec,float param_5)

{
  byte bVar1;
  vw *pvVar2;
  float *pfVar3;
  _func_void_weight_ptr_void_ptr *p_Var4;
  size_t sVar5;
  size_t sVar6;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> _Var7;
  weight *pwVar8;
  long lVar9;
  size_t sVar10;
  byte *pbVar11;
  ulong uVar12;
  float *pfVar13;
  long lVar14;
  ulong uVar15;
  ulong *puVar16;
  features *pfVar17;
  float fVar18;
  float fVar19;
  example *__range2;
  uint64_t index;
  float local_90;
  float local_8c;
  ulong local_78;
  float local_70;
  float local_6c;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_68;
  undefined8 local_60;
  float *local_58;
  v_array<float> *local_50;
  features *local_48;
  byte *local_40;
  byte *local_38;
  
  pvVar2 = l->all;
  local_50 = Elogtheta;
  v_array<float>::clear((v_array<float> *)&(anonymous_namespace)::new_gamma);
  v_array<float>::clear((v_array<float> *)&(anonymous_namespace)::old_gamma);
  if (l->topics == 0) {
    uVar12 = 0;
  }
  else {
    uVar15 = 0;
    do {
      local_60._0_4_ = 1.0;
      v_array<float>::push_back
                ((v_array<float> *)&(anonymous_namespace)::new_gamma,(float *)&local_60);
      local_60 = (ulong)local_60._4_4_ << 0x20;
      v_array<float>::push_back
                ((v_array<float> *)&(anonymous_namespace)::old_gamma,(float *)&local_60);
      uVar15 = uVar15 + 1;
      uVar12 = l->topics;
    } while (uVar15 < uVar12);
  }
  pfVar17 = (ec->super_example_predict).feature_space;
  local_68 = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)&(pvVar2->weights).sparse_weights;
  local_48 = pfVar17;
  do {
    memcpy(v,(anonymous_namespace)::new_gamma,uVar12 << 2);
    lda::expdigammify(l,l->all,v);
    memcpy((anonymous_namespace)::old_gamma,(anonymous_namespace)::new_gamma,l->topics << 2);
    memset((anonymous_namespace)::new_gamma,0,l->topics << 2);
    pbVar11 = (ec->super_example_predict).indices._begin;
    local_40 = (ec->super_example_predict).indices._end;
    if (pbVar11 == local_40) {
      local_8c = 0.0;
      local_90 = 0.0;
    }
    else {
      local_90 = 0.0;
      local_8c = 0.0;
      do {
        bVar1 = *pbVar11;
        pfVar13 = pfVar17[bVar1].values._begin;
        pfVar3 = pfVar17[bVar1].values._end;
        local_38 = pbVar11;
        if (pfVar13 != pfVar3) {
          puVar16 = pfVar17[bVar1].indicies._begin;
          do {
            if ((pvVar2->weights).sparse == true) {
              local_78 = *puVar16 & (pvVar2->weights).sparse_weights._weight_mask;
              _Var7._M_cur = (__node_type *)
                             std::
                             _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             ::find(local_68,&local_78);
              if (_Var7._M_cur == (__node_type *)0x0) {
                local_58 = calloc_or_throw<float>
                                     (1L << ((byte)(pvVar2->weights).sparse_weights._stride_shift &
                                            0x3f));
                this = local_68;
                local_60 = local_78;
                std::
                _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                ::_M_emplace<std::pair<unsigned_long,float*>>
                          ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                            *)local_68,&local_60);
                _Var7._M_cur = (__node_type *)
                               std::
                               _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               ::find(this,&local_78);
                p_Var4 = (pvVar2->weights).sparse_weights.fun;
                if (p_Var4 != (_func_void_weight_ptr_void_ptr *)0x0) {
                  (*p_Var4)(*(weight **)((long)_Var7._M_cur + 0x10),
                            (pvVar2->weights).sparse_weights.default_data);
                }
              }
              pwVar8 = *(weight **)
                        ((long)&((_Var7._M_cur)->
                                super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                                ).
                                super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                                ._M_storage._M_storage + 8);
            }
            else {
              pwVar8 = (pvVar2->weights).dense_weights._begin +
                       (*puVar16 & (pvVar2->weights).dense_weights._weight_mask);
            }
            sVar5 = l->topics;
            if (sVar5 == 0) {
              local_70 = 0.0;
            }
            else {
              local_70 = 0.0;
              lVar9 = 0;
              do {
                local_70 = local_70 +
                           *(float *)((long)pwVar8 + lVar9 + sVar5 * 4 + 4) *
                           *(float *)((long)v + lVar9);
                lVar9 = lVar9 + 4;
              } while (lVar9 != sVar5 * 4);
            }
            local_70 = 1.0 / local_70;
            local_6c = *pfVar13;
            fVar18 = logf(local_70);
            sVar6 = l->topics;
            if (sVar6 != 0) {
              sVar10 = 0;
              do {
                (anonymous_namespace)::new_gamma[sVar10] =
                     pwVar8[sVar5 + sVar10 + 1] * local_70 * local_6c +
                     (anonymous_namespace)::new_gamma[sVar10];
                sVar10 = sVar10 + 1;
              } while (sVar6 != sVar10);
            }
            local_8c = local_8c + *pfVar13;
            local_90 = local_90 - local_6c * fVar18;
            pfVar13 = pfVar13 + 1;
            puVar16 = puVar16 + 1;
          } while (pfVar13 != pfVar3);
        }
        pbVar11 = local_38 + 1;
        pfVar17 = local_48;
      } while (pbVar11 != local_40);
    }
    if (l->topics == 0) {
      uVar12 = 0;
    }
    else {
      uVar15 = 0;
      do {
        (anonymous_namespace)::new_gamma[uVar15] =
             (anonymous_namespace)::new_gamma[uVar15] * v[uVar15] + l->lda_alpha;
        uVar15 = uVar15 + 1;
        uVar12 = l->topics;
      } while (uVar15 < uVar12);
    }
    uVar15 = (ulong)l->all->lda;
    if (uVar15 == 0) break;
    lVar9 = uVar15 << 2;
    fVar18 = 0.0;
    lVar14 = 0;
    do {
      fVar18 = fVar18 + ABS(*(float *)((long)(anonymous_namespace)::old_gamma + lVar14) -
                            *(float *)((long)(anonymous_namespace)::new_gamma + lVar14));
      lVar14 = lVar14 + 4;
    } while (lVar9 != lVar14);
    fVar19 = 0.0;
    lVar14 = 0;
    do {
      fVar19 = fVar19 + *(float *)((long)(anonymous_namespace)::new_gamma + lVar14);
      lVar14 = lVar14 + 4;
    } while (lVar9 != lVar14);
  } while (l->lda_epsilon <= fVar18 / fVar19 && fVar18 / fVar19 != l->lda_epsilon);
  v_array<float>::clear(&(ec->pred).scalars);
  v_array<float>::resize(&(ec->pred).scalars,l->topics);
  memcpy((ec->pred).scalars._begin,(anonymous_namespace)::new_gamma,l->topics << 2);
  (ec->pred).scalars._end = (ec->pred).scalars._begin + l->topics;
  fVar18 = theta_kl(l,local_50,(anonymous_namespace)::new_gamma);
  return (fVar18 + local_90) / local_8c;
}

Assistant:

float lda_loop(lda &l, v_array<float> &Elogtheta, float *v, example *ec, float)
{
  parameters &weights = l.all->weights;
  new_gamma.clear();
  old_gamma.clear();

  for (size_t i = 0; i < l.topics; i++)
  {
    new_gamma.push_back(1.f);
    old_gamma.push_back(0.f);
  }
  size_t num_words = 0;
  for (features &fs : *ec) num_words += fs.size();

  float xc_w = 0;
  float score = 0;
  float doc_length = 0;
  do
  {
    memcpy(v, new_gamma.begin(), sizeof(float) * l.topics);
    l.expdigammify(*l.all, v);

    memcpy(old_gamma.begin(), new_gamma.begin(), sizeof(float) * l.topics);
    memset(new_gamma.begin(), 0, sizeof(float) * l.topics);

    score = 0;
    size_t word_count = 0;
    doc_length = 0;
    for (features &fs : *ec)
    {
      for (features::iterator &f : fs)
      {
        float *u_for_w = &(weights[f.index()]) + l.topics + 1;
        float c_w = find_cw(l, u_for_w, v);
        xc_w = c_w * f.value();
        score += -f.value() * log(c_w);
        size_t max_k = l.topics;
        for (size_t k = 0; k < max_k; k++, ++u_for_w) new_gamma[k] += xc_w * *u_for_w;
        word_count++;
        doc_length += f.value();
      }
    }
    for (size_t k = 0; k < l.topics; k++) new_gamma[k] = new_gamma[k] * v[k] + l.lda_alpha;
  } while (average_diff(*l.all, old_gamma.begin(), new_gamma.begin()) > l.lda_epsilon);

  ec->pred.scalars.clear();
  ec->pred.scalars.resize(l.topics);
  memcpy(ec->pred.scalars.begin(), new_gamma.begin(), l.topics * sizeof(float));
  ec->pred.scalars.end() = ec->pred.scalars.begin() + l.topics;

  score += theta_kl(l, Elogtheta, new_gamma.begin());

  return score / doc_length;
}